

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O3

wchar_t archive_string_normalize_D(archive_string *as,void *_p,size_t len,archive_string_conv *sc)

{
  byte bVar1;
  char cVar2;
  wchar_t wVar3;
  archive_string *paVar4;
  long lVar5;
  int iVar6;
  undefined7 uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  char *pcVar18;
  size_t sVar19;
  char *pcVar20;
  uint uVar21;
  undefined8 unaff_R15;
  undefined7 uVar24;
  ulong uVar22;
  char *pcVar23;
  uint32_t uc;
  uint32_t uc2;
  anon_struct_8_2_74731b7c fdc [10];
  uint local_fc;
  size_t local_f8;
  code *local_f0;
  undefined8 local_e8;
  undefined4 local_dc;
  long local_d8;
  char *local_d0;
  long local_c8;
  wchar_t local_bc;
  long local_b8;
  uint local_ac;
  code *local_a8;
  int local_9c;
  ulong local_98;
  ulong local_90;
  undefined8 local_88;
  
  wVar3 = sc->flag;
  uVar7 = (undefined7)((ulong)sc >> 8);
  uVar24 = (undefined7)((ulong)unaff_R15 >> 8);
  if (((uint)wVar3 >> 10 & 1) == 0) {
    if (((uint)wVar3 >> 0xc & 1) == 0) {
      if (((uint)wVar3 >> 8 & 1) == 0) {
        if (((uint)wVar3 >> 0xb & 1) == 0) {
          uVar21 = (uint)wVar3 >> 0xd & 1;
          uVar16 = (ulong)uVar21;
          lVar5 = uVar16 + 1;
          local_f0 = unicode_to_utf8;
          if (uVar21 != 0) {
            local_f0 = unicode_to_utf16le;
          }
        }
        else {
          local_f0 = unicode_to_utf16be;
          lVar5 = 2;
          uVar16 = CONCAT71(uVar24,1);
        }
        local_dc = 0;
      }
      else {
        local_dc = (undefined4)CONCAT71(uVar7,((uint)wVar3 >> 9 & 1) == 0);
        local_f0 = unicode_to_utf8;
        lVar5 = 1;
        uVar16 = 0;
      }
      goto LAB_00160d9d;
    }
    local_dc = (undefined4)CONCAT71(uVar7,((uint)wVar3 >> 0xd & 1) == 0);
    local_f0 = unicode_to_utf16le;
  }
  else {
    local_dc = (undefined4)CONCAT71(uVar7,((uint)wVar3 >> 0xb & 1) == 0);
    local_f0 = unicode_to_utf16be;
  }
  lVar5 = 2;
  uVar16 = CONCAT71(uVar24,1);
LAB_00160d9d:
  lVar15 = 1;
  iVar6 = 4;
  if (((uint)wVar3 >> 0xb & 1) == 0) {
    if (((uint)wVar3 >> 0xd & 1) == 0) {
      local_a8 = cesu8_to_unicode;
      iVar6 = 6;
      lVar15 = lVar5;
    }
    else {
      local_a8 = utf16le_to_unicode;
    }
  }
  else {
    local_a8 = utf16be_to_unicode;
  }
  local_d0 = (char *)_p;
  paVar4 = archive_string_ensure(as,lVar15 * len + lVar5 + as->length);
  pcVar23 = local_d0;
  local_bc = L'\xffffffff';
  if (paVar4 != (archive_string *)0x0) {
    pcVar10 = as->s;
    sVar19 = as->buffer_length;
    pcVar14 = pcVar10 + as->length;
    local_f8 = len;
    local_d8 = lVar5;
    local_b8 = lVar15;
    local_9c = iVar6;
    local_90 = uVar16;
    uVar21 = (*local_a8)(&local_fc,local_d0);
    if (uVar21 == 0) {
      local_bc = L'\0';
    }
    else {
      local_c8 = -local_d8;
      pcVar10 = pcVar10 + local_c8 + sVar19;
      local_bc = L'\0';
      do {
        uVar16 = (ulong)uVar21;
        if (-1 < (int)uVar21) {
LAB_00160e73:
          lVar5 = local_b8;
          pcVar18 = pcVar23;
          if ((int)uVar16 == local_9c) {
            pcVar18 = (char *)0x0;
          }
          if ((char)local_dc != '\0') {
            pcVar18 = (char *)0x0;
          }
          local_d0 = pcVar23 + uVar16;
          sVar19 = local_f8 - uVar16;
          uVar21 = local_fc - 0xac00;
          local_f8 = sVar19;
          if (uVar21 < 0x2ba4) {
            local_e8 = (char *)(CONCAT44(local_e8._4_4_,uVar21) & 0xffffffff0000ffff);
            uVar17 = (uVar21 & 0xffff) / 0x24c;
            local_fc = uVar17 + 0x1100;
            lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14);
            if (lVar5 == 0) {
              lVar15 = local_f8 * local_b8 + local_d8;
              do {
                as->length = (long)pcVar14 - (long)as->s;
                paVar4 = archive_string_ensure(as,as->buffer_length + lVar15);
                if (paVar4 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar14 = as->s + as->length;
                pcVar10 = as->s + local_c8 + as->buffer_length;
                lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
              } while (lVar5 == 0);
            }
            pcVar14 = pcVar14 + lVar5;
            local_fc = ((uVar21 + uVar17 * -0x24c & 0xffff) * 0x925 >> 0x10) + 0x1161;
            lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14);
            if (lVar5 == 0) {
              lVar15 = local_f8 * local_b8 + local_d8;
              do {
                as->length = (long)pcVar14 - (long)as->s;
                paVar4 = archive_string_ensure(as,as->buffer_length + lVar15);
                if (paVar4 == (archive_string *)0x0) {
                  return L'\xffffffff';
                }
                pcVar14 = as->s + as->length;
                pcVar10 = as->s + local_c8 + as->buffer_length;
                lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
              } while (lVar5 == 0);
            }
            sVar19 = local_f8;
            pcVar14 = pcVar14 + lVar5;
            uVar17 = ((uint)local_e8 >> 2) * 0x4925;
            pcVar23 = local_d0;
            if ((ushort)((short)uVar21 + (ushort)(uVar17 >> 0x11) * -0x1c) != 0) {
              local_fc = uVar21 + (uVar17 >> 0x11) * -0x1c + 0x11a7 & 0xffff;
              lVar15 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14);
              if (lVar15 == 0) {
                lVar5 = sVar19 * local_b8 + local_d8;
                do {
                  as->length = (long)pcVar14 - (long)as->s;
                  paVar4 = archive_string_ensure(as,as->buffer_length + lVar5);
                  if (paVar4 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  pcVar14 = as->s + as->length;
                  pcVar10 = as->s + local_c8 + as->buffer_length;
                  lVar15 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
                  sVar19 = local_f8;
                } while (lVar15 == 0);
              }
LAB_001616e6:
              local_f8 = sVar19;
              pcVar14 = pcVar14 + lVar15;
              pcVar23 = local_d0;
            }
          }
          else {
            if ((((0x1d2ff < local_fc) || (0x1d244 < local_fc)) || (""[local_fc >> 8] == '\0')) ||
               (ccc_val[ccc_val_index[""[local_fc >> 8]][local_fc >> 4 & 0xf]][local_fc & 0xf] ==
                '\0')) {
              uVar22 = 0;
              local_e8 = pcVar18;
              local_98 = uVar16;
              if (((0x2ff < local_fc - 0x2f800) && ((local_fc & 0xfffff000) != 0x2000)) &&
                 (0x1ff < local_fc - 0xf900)) {
                lVar5 = 1;
                uVar22 = 0;
LAB_00160f5a:
                local_e8 = pcVar18;
                if ((0x11 < local_fc - 0x1109a) ||
                   ((0x20005U >> (local_fc - 0x1109a & 0x1f) & 1) == 0)) {
                  iVar6 = 0;
                  iVar13 = 0x3a2;
                  do {
                    iVar12 = (iVar6 + iVar13) / 2;
                    if (u_decomposition_table[iVar12].nfc < local_fc) {
                      iVar6 = iVar12 + 1;
                    }
                    else {
                      if (u_decomposition_table[iVar12].nfc <= local_fc) goto LAB_00160fb0;
                      iVar13 = iVar12 + -1;
                    }
                    if (iVar13 < iVar6) break;
                  } while( true );
                }
              }
LAB_001610a7:
              do {
                uVar21 = (*local_a8)(&local_ac,local_d0,sVar19);
                uVar16 = (ulong)uVar21;
                if (((((int)uVar21 < 1) || (0x1d244 < local_ac)) ||
                    (bVar1 = ccc_val[ccc_val_index[""[local_ac >> 8]][local_ac >> 4 & 0xf]]
                             [local_ac & 0xf], bVar1 == 0)) || (9 < uVar22)) goto LAB_00161181;
                uVar9 = uVar22;
                if (uVar22 != 0) {
                  uVar8 = 0;
                  do {
                    if ((int)(uint)bVar1 < *(int *)((long)&local_88 + (uVar8 * 2 + 1) * 4)) {
                      uVar9 = uVar8;
                      uVar11 = uVar22;
                      if (uVar8 < uVar22) {
                        do {
                          (&local_88)[uVar11] = (&local_90)[uVar11];
                          uVar11 = uVar11 - 1;
                        } while ((long)uVar8 < (long)uVar11);
                      }
                      break;
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar22 != uVar8);
                }
                local_d0 = local_d0 + uVar16;
                sVar19 = sVar19 - uVar16;
                *(uint *)((long)&local_88 + (uVar9 * 2 + 1) * 4) = (uint)bVar1;
                *(uint *)(&local_88 + uVar9) = local_ac;
                uVar22 = uVar22 + 1;
              } while( true );
            }
            if (pcVar18 == (char *)0x0) {
              lVar15 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14);
              sVar19 = local_f8;
              if (lVar15 == 0) {
                lVar5 = local_f8 * lVar5 + local_d8;
                do {
                  as->length = (long)pcVar14 - (long)as->s;
                  paVar4 = archive_string_ensure(as,as->buffer_length + lVar5);
                  if (paVar4 == (archive_string *)0x0) {
                    return L'\xffffffff';
                  }
                  pcVar14 = as->s + as->length;
                  pcVar10 = as->s + local_c8 + as->buffer_length;
                  lVar15 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
                  sVar19 = local_f8;
                } while (lVar15 == 0);
              }
              goto LAB_001616e6;
            }
            pcVar20 = pcVar23;
            if (pcVar10 < pcVar14 + uVar16) {
              as->length = (long)pcVar14 - (long)as->s;
              local_e8 = pcVar23;
              paVar4 = archive_string_ensure(as,sVar19 * local_b8 + local_d8 + as->buffer_length);
              if (paVar4 == (archive_string *)0x0) {
                return L'\xffffffff';
              }
              pcVar14 = as->s + as->length;
              pcVar10 = as->s + local_c8 + as->buffer_length;
              pcVar20 = local_e8;
            }
            pcVar23 = local_d0;
            switch((int)uVar16) {
            case 1:
              break;
            case 4:
              pcVar20 = pcVar18 + 1;
              *pcVar14 = *pcVar18;
              pcVar14 = pcVar14 + 1;
            case 3:
              cVar2 = *pcVar20;
              pcVar20 = pcVar20 + 1;
              *pcVar14 = cVar2;
              pcVar14 = pcVar14 + 1;
            case 2:
              cVar2 = *pcVar20;
              pcVar20 = pcVar20 + 1;
              *pcVar14 = cVar2;
              pcVar14 = pcVar14 + 1;
              break;
            default:
              goto switchD_0016166d_default;
            }
            *pcVar14 = *pcVar20;
            pcVar14 = pcVar14 + 1;
          }
          goto switchD_0016166d_default;
        }
LAB_00161363:
        lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14);
        if (lVar5 == 0) {
          lVar15 = local_f8 * local_b8 + local_d8;
          do {
            as->length = (long)pcVar14 - (long)as->s;
            paVar4 = archive_string_ensure(as,as->buffer_length + lVar15);
            if (paVar4 == (archive_string *)0x0) {
              return L'\xffffffff';
            }
            pcVar14 = as->s + as->length;
            pcVar10 = as->s + local_c8 + as->buffer_length;
            lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
          } while (lVar5 == 0);
        }
        pcVar14 = pcVar14 + lVar5;
        local_f8 = local_f8 - -uVar21;
        local_bc = L'\xffffffff';
        pcVar23 = pcVar23 + -uVar21;
switchD_0016166d_default:
        uVar21 = (*local_a8)(&local_fc,pcVar23,local_f8);
      } while (uVar21 != 0);
    }
LAB_00161747:
    as->length = (long)pcVar14 - (long)as->s;
    *pcVar14 = '\0';
    if ((char)local_90 != '\0') {
      as->s[as->length + 1] = '\0';
    }
  }
  return local_bc;
LAB_00160fb0:
  if (9 < (uint)uVar22) goto LAB_001610a7;
  lVar15 = lVar5;
  if ((uint)uVar22 != 0) {
    do {
      (&local_90)[lVar15] = (&local_88)[(int)lVar15 - 2];
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
  }
  local_88._0_4_ = u_decomposition_table[iVar12].cp2;
  local_88._4_4_ = 0;
  if ((uint)local_88 < 0x1d245) {
    local_88._4_4_ =
         (uint)ccc_val[ccc_val_index[""[(uint)local_88 >> 8]][(uint)local_88 >> 4 & 0xf]]
               [(uint)local_88 & 0xf];
  }
  local_fc = u_decomposition_table[iVar12].cp1;
  uVar22 = uVar22 + 1;
  if ((local_fc - 0x2f800 < 0x300) || ((local_fc & 0xfffff000) == 0x2000)) {
    local_e8 = (char *)0x0;
    goto LAB_001610a7;
  }
  lVar5 = lVar5 + 1;
  pcVar18 = (char *)0x0;
  local_e8 = (char *)0x0;
  if (local_fc - 0xf900 < 0x200) goto LAB_001610a7;
  goto LAB_00160f5a;
LAB_00161181:
  local_f8 = sVar19;
  if (local_e8 == (char *)0x0) {
    lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
    if (lVar5 == 0) {
      lVar15 = sVar19 * local_b8 + local_d8;
      do {
        as->length = (long)pcVar14 - (long)as->s;
        paVar4 = archive_string_ensure(as,as->buffer_length + lVar15);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar14 = as->s + as->length;
        pcVar10 = as->s + local_c8 + as->buffer_length;
        lVar5 = (*local_f0)(pcVar14,(long)pcVar10 - (long)pcVar14,local_fc);
        sVar19 = local_f8;
      } while (lVar5 == 0);
    }
    pcVar14 = pcVar14 + lVar5;
    goto switchD_001611fb_default;
  }
  if (pcVar10 < pcVar14 + local_98) {
    as->length = (long)pcVar14 - (long)as->s;
    paVar4 = archive_string_ensure(as,sVar19 * local_b8 + local_d8 + as->buffer_length);
    if (paVar4 == (archive_string *)0x0) {
      return L'\xffffffff';
    }
    pcVar14 = as->s + as->length;
    pcVar10 = as->s + local_c8 + as->buffer_length;
  }
  sVar19 = local_f8;
  switch((int)local_98) {
  case 1:
    pcVar23 = local_e8;
    goto LAB_001612b1;
  case 2:
    pcVar23 = local_e8;
    goto LAB_001612a5;
  case 3:
    pcVar23 = local_e8;
    break;
  case 4:
    *pcVar14 = *local_e8;
    pcVar14 = pcVar14 + 1;
    pcVar23 = local_e8 + 1;
    break;
  default:
    goto switchD_001611fb_default;
  }
  *pcVar14 = *pcVar23;
  pcVar14 = pcVar14 + 1;
  pcVar23 = pcVar23 + 1;
LAB_001612a5:
  *pcVar14 = *pcVar23;
  pcVar14 = pcVar14 + 1;
  pcVar23 = pcVar23 + 1;
LAB_001612b1:
  *pcVar14 = *pcVar23;
  pcVar14 = pcVar14 + 1;
switchD_001611fb_default:
  if ((int)uVar22 != 0) {
    lVar5 = sVar19 * local_b8 + local_d8;
    local_e8 = (char *)(uVar22 & 0xffffffff);
    pcVar23 = (char *)0x0;
    do {
      local_fc = *(uint *)(&local_88 + (long)pcVar23);
      lVar15 = (long)pcVar10 - (long)pcVar14;
      while (lVar15 = (*local_f0)(pcVar14,lVar15,local_fc), lVar15 == 0) {
        as->length = (long)pcVar14 - (long)as->s;
        paVar4 = archive_string_ensure(as,as->buffer_length + lVar5);
        if (paVar4 == (archive_string *)0x0) {
          return L'\xffffffff';
        }
        pcVar14 = as->s + as->length;
        pcVar10 = as->s + local_c8 + as->buffer_length;
        lVar15 = (long)pcVar10 - (long)pcVar14;
      }
      pcVar14 = pcVar14 + lVar15;
      pcVar23 = pcVar23 + 1;
    } while (pcVar23 != local_e8);
  }
  if (uVar21 == 0) goto LAB_00161747;
  local_fc = local_ac;
  pcVar23 = local_d0;
  if ((int)uVar21 < 0) goto LAB_00161363;
  goto LAB_00160e73;
}

Assistant:

static int
archive_string_normalize_D(struct archive_string *as, const void *_p,
    size_t len, struct archive_string_conv *sc)
{
	const char *s = (const char *)_p;
	char *p, *endp;
	uint32_t uc, uc2;
	size_t w;
	int always_replace, n, n2, ret = 0, spair, ts, tm;
	int (*parse)(uint32_t *, const char *, size_t);
	size_t (*unparse)(char *, size_t, uint32_t);

	always_replace = 1;
	ts = 1;/* text size. */
	if (sc->flag & SCONV_TO_UTF16BE) {
		unparse = unicode_to_utf16be;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16BE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF16LE) {
		unparse = unicode_to_utf16le;
		ts = 2;
		if (sc->flag & SCONV_FROM_UTF16LE)
			always_replace = 0;
	} else if (sc->flag & SCONV_TO_UTF8) {
		unparse = unicode_to_utf8;
		if (sc->flag & SCONV_FROM_UTF8)
			always_replace = 0;
	} else {
		/*
		 * This case is going to be converted to another
		 * character-set through iconv.
		 */
		always_replace = 0;
		if (sc->flag & SCONV_FROM_UTF16BE) {
			unparse = unicode_to_utf16be;
			ts = 2;
		} else if (sc->flag & SCONV_FROM_UTF16LE) {
			unparse = unicode_to_utf16le;
			ts = 2;
		} else {
			unparse = unicode_to_utf8;
		}
	}

	if (sc->flag & SCONV_FROM_UTF16BE) {
		parse = utf16be_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else if (sc->flag & SCONV_FROM_UTF16LE) {
		parse = utf16le_to_unicode;
		tm = 1;
		spair = 4;/* surrogate pair size in UTF-16. */
	} else {
		parse = cesu8_to_unicode;
		tm = ts;
		spair = 6;/* surrogate pair size in UTF-8. */
	}

	if (archive_string_ensure(as, as->length + len * tm + ts) == NULL)
		return (-1);

	p = as->s + as->length;
	endp = as->s + as->buffer_length - ts;
	while ((n = parse(&uc, s, len)) != 0) {
		const char *ucptr;
		uint32_t cp1, cp2;
		int SIndex;
		struct {
			uint32_t uc;
			int ccc;
		} fdc[FDC_MAX];
		int fdi, fdj;
		int ccc;

check_first_code:
		if (n < 0) {
			/* Use a replaced unicode character. */
			UNPARSE(p, endp, uc);
			s += n*-1;
			len -= n*-1;
			ret = -1;
			continue;
		} else if (n == spair || always_replace)
			/* uc is converted from a surrogate pair.
			 * this should be treated as a changed code. */
			ucptr = NULL;
		else
			ucptr = s;
		s += n;
		len -= n;

		/* Hangul Decomposition. */
		if ((SIndex = uc - HC_SBASE) >= 0 && SIndex < HC_SCOUNT) {
			int L = HC_LBASE + SIndex / HC_NCOUNT;
			int V = HC_VBASE + (SIndex % HC_NCOUNT) / HC_TCOUNT;
			int T = HC_TBASE + SIndex % HC_TCOUNT;

			REPLACE_UC_WITH(L);
			WRITE_UC();
			REPLACE_UC_WITH(V);
			WRITE_UC();
			if (T != HC_TBASE) {
				REPLACE_UC_WITH(T);
				WRITE_UC();
			}
			continue;
		}
		if (IS_DECOMPOSABLE_BLOCK(uc) && CCC(uc) != 0) {
			WRITE_UC();
			continue;
		}

		fdi = 0;
		while (get_nfd(&cp1, &cp2, uc) && fdi < FDC_MAX) {
			int k;

			for (k = fdi; k > 0; k--)
				fdc[k] = fdc[k-1];
			fdc[0].ccc = CCC(cp2);
			fdc[0].uc = cp2;
			fdi++;
			REPLACE_UC_WITH(cp1);
		}

		/* Read following code points. */
		while ((n2 = parse(&uc2, s, len)) > 0 &&
		    (ccc = CCC(uc2)) != 0 && fdi < FDC_MAX) {
			int j, k;

			s += n2;
			len -= n2;
			for (j = 0; j < fdi; j++) {
				if (fdc[j].ccc > ccc)
					break;
			}
			if (j < fdi) {
				for (k = fdi; k > j; k--)
					fdc[k] = fdc[k-1];
				fdc[j].ccc = ccc;
				fdc[j].uc = uc2;
			} else {
				fdc[fdi].ccc = ccc;
				fdc[fdi].uc = uc2;
			}
			fdi++;
		}

		WRITE_UC();
		for (fdj = 0; fdj < fdi; fdj++) {
			REPLACE_UC_WITH(fdc[fdj].uc);
			WRITE_UC();
		}

		if (n2 == 0)
			break;
		REPLACE_UC_WITH(uc2);
		n = n2;
		goto check_first_code;
	}
	as->length = p - as->s;
	as->s[as->length] = '\0';
	if (ts == 2)
		as->s[as->length+1] = '\0';
	return (ret);
}